

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr.c
# Opt level: O1

void ustr_initChars(UString_conflict *s,char *source,int32_t length,UErrorCode *status)

{
  int32_t len;
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  UChar charToAppend;
  UChar local_2a;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  sVar1 = (size_t)(uint)length;
  s->fChars = (UChar *)0x0;
  s->fLength = 0;
  s->fCapacity = 0;
  if (length == -1) {
    sVar1 = strlen(source);
  }
  iVar2 = (int)sVar1;
  if (0 < iVar2) {
    len = (iVar2 * 2 & 0xffffff80U) + 0x80;
    if (iVar2 < 0x80) {
      len = 0x80;
    }
    ustr_resize(s,len,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar3 = sVar1 & 0xffffffff;
      do {
        u_charsToUChars_63(source,&local_2a,1);
        ustr_ucat(s,local_2a,status);
        source = source + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

U_CFUNC void
ustr_initChars(struct UString *s, const char* source, int32_t length, UErrorCode *status)
{
    int i = 0;
    if (U_FAILURE(*status)) return;
    s->fChars = 0;
    s->fLength = s->fCapacity = 0;
    if (length == -1) {
        length = (int32_t)uprv_strlen(source);
    }
    if(s->fCapacity < length) {
      ustr_resize(s, ALLOCATION(length), status);
      if(U_FAILURE(*status)) return;
    }
    for (; i < length; i++)
    {
      UChar charToAppend;
      u_charsToUChars(source+i, &charToAppend, 1);
      ustr_ucat(s, charToAppend, status);
      /*
#if U_CHARSET_FAMILY==U_ASCII_FAMILY
        ustr_ucat(s, (UChar)(uint8_t)(source[i]), status);
#elif U_CHARSET_FAMILY==U_EBCDIC_FAMILY
        ustr_ucat(s, (UChar)asciiFromEbcdic[(uint8_t)(*cs++)], status);
#else
#   error U_CHARSET_FAMILY is not valid
#endif
      */
    }
}